

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enum_field.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::java::ImmutableEnumOneofFieldLiteGenerator::
ImmutableEnumOneofFieldLiteGenerator
          (ImmutableEnumOneofFieldLiteGenerator *this,FieldDescriptor *descriptor,
          int messageBitIndex,Context *context)

{
  OneofGeneratorInfo *info;
  OneofDescriptor *oneof;
  
  ImmutableEnumFieldLiteGenerator::ImmutableEnumFieldLiteGenerator
            (&this->super_ImmutableEnumFieldLiteGenerator,descriptor,messageBitIndex,context);
  (this->super_ImmutableEnumFieldLiteGenerator).super_ImmutableFieldLiteGenerator.
  super_FieldGenerator._vptr_FieldGenerator =
       (_func_int **)&PTR__ImmutableEnumOneofFieldLiteGenerator_0082c580;
  if ((descriptor->field_0x1 & 0x10) == 0) {
    oneof = (OneofDescriptor *)0x0;
  }
  else {
    oneof = (descriptor->scope_).containing_oneof;
    if (oneof == (OneofDescriptor *)0x0) {
      protobuf::internal::protobuf_assumption_failed
                ("res != nullptr",
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                 ,0xb31);
    }
  }
  info = Context::GetOneofGeneratorInfo(context,oneof);
  SetCommonOneofVariables(descriptor,info,&(this->super_ImmutableEnumFieldLiteGenerator).variables_)
  ;
  return;
}

Assistant:

ImmutableEnumOneofFieldLiteGenerator::ImmutableEnumOneofFieldLiteGenerator(
    const FieldDescriptor* descriptor, int messageBitIndex, Context* context)
    : ImmutableEnumFieldLiteGenerator(descriptor, messageBitIndex, context) {
  const OneofGeneratorInfo* info =
      context->GetOneofGeneratorInfo(descriptor->containing_oneof());
  SetCommonOneofVariables(descriptor, info, &variables_);
}